

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaForce.c
# Opt level: O2

Vec_Int_t * Frc_ManCollectCos(Frc_Man_t *p)

{
  int iVar1;
  Vec_Int_t *p_00;
  int i;
  
  p_00 = Vec_IntAlloc(p->vCos->nSize);
  i = 0;
  while( true ) {
    if (p->vCos->nSize <= i) {
      return p_00;
    }
    iVar1 = Vec_IntEntry(p->vCos,i);
    if (p->pObjData == (int *)0x0) break;
    Vec_IntPush(p_00,p->pObjData[(long)iVar1 + 3]);
    i = i + 1;
  }
  return p_00;
}

Assistant:

Vec_Int_t * Frc_ManCollectCos( Frc_Man_t * p )
{
    Vec_Int_t * vCoOrder;
    Frc_Obj_t * pObj;
    int i;
    vCoOrder = Vec_IntAlloc( Frc_ManCoNum(p) );
    Frc_ManForEachCo( p, pObj, i )
        Vec_IntPush( vCoOrder, pObj->hHandle );
    return vCoOrder;
}